

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O0

double Distance::getWeightedRobinsonFouldsDistance(PhyloTree *t1,PhyloTree *t2,bool normalise)

{
  bool bVar1;
  reference pPVar2;
  ulong uVar3;
  size_type sVar4;
  byte in_DL;
  vector<double,_std::allocator<double>_> *this;
  PhyloTree *extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar5;
  int i;
  PhyloTreeEdge *pte_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge *pte;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<double,_std::allocator<double>_> leaves2;
  vector<double,_std::allocator<double>_> leaves1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> enic;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> eic;
  double wrf_value;
  PhyloTree *in_stack_fffffffffffffeb8;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_stack_fffffffffffffec0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffed0;
  PhyloTree *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar6;
  PhyloTree *in_stack_ffffffffffffff28;
  PhyloTree *in_stack_ffffffffffffff30;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_c8;
  undefined1 *local_c0;
  reference local_b8;
  PhyloTreeEdge *local_b0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_a8;
  undefined1 *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  undefined1 local_68 [40];
  undefined1 local_40 [24];
  double local_28;
  byte local_19;
  double local_8;
  
  local_19 = in_DL & 1;
  local_28 = 0.0;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x18add0);
  PhyloTree::getCommonEdges
            ((PhyloTree *)
             enic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (PhyloTree *)
             enic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             enic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x18adfe);
  PhyloTree::getEdgesNotInCommonWith
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  PhyloTree::getEdgesNotInCommonWith
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  PhyloTree::getLeafEdgeLengths(in_stack_fffffffffffffeb8);
  PhyloTree::getLeafEdgeLengths(in_stack_fffffffffffffeb8);
  local_a0 = local_40;
  local_a8._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffeb8
                 );
  local_b0 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffec0,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator*(&local_a8);
    local_b8 = pPVar2;
    PhyloTreeEdge::getLength(pPVar2);
    std::abs((int)pPVar2);
    local_28 = (double)extraout_XMM0_Qa + local_28;
    in_stack_ffffffffffffff00 = extraout_XMM0_Qa;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_a8);
  }
  local_c0 = local_68;
  local_c8._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffeb8
                 );
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffec0,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator*(&local_c8);
    PhyloTreeEdge::getLength(pPVar2);
    std::abs((int)pPVar2);
    local_28 = extraout_XMM0_Qa_00 + local_28;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_c8);
  }
  iVar6 = 0;
  while( true ) {
    uVar3 = (ulong)iVar6;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_80);
    local_8 = local_28;
    if (sVar4 <= uVar3) break;
    std::vector<double,_std::allocator<double>_>::operator[](&local_80,(long)iVar6);
    this = &local_98;
    std::vector<double,_std::allocator<double>_>::operator[](this,(long)iVar6);
    std::abs((int)this);
    local_28 = extraout_XMM0_Qa_01 + local_28;
    iVar6 = iVar6 + 1;
  }
  if ((local_19 & 1) == 0) {
  }
  else {
    in_stack_fffffffffffffed0 =
         (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
         PhyloTree::getBranchLengthSum(in_stack_ffffffffffffff00);
    dVar5 = PhyloTree::getBranchLengthSum(in_stack_ffffffffffffff00);
    local_8 = local_8 / ((double)in_stack_fffffffffffffed0 + dVar5);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(in_stack_fffffffffffffed0);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(in_stack_fffffffffffffed0);
  return local_8;
}

Assistant:

double Distance::getWeightedRobinsonFouldsDistance(PhyloTree &t1, PhyloTree &t2, bool normalise) {
    double wrf_value = 0;

    // Collect edges-in-common and edges-not-in-common...
    vector<PhyloTreeEdge> eic;
    PhyloTree::getCommonEdges(t1, t2, eic);
    vector<PhyloTreeEdge> enic;
    t1.getEdgesNotInCommonWith(t2, enic);
    t2.getEdgesNotInCommonWith(t1, enic);
    // ... and leaves
    vector<double> leaves1 = t1.getLeafEdgeLengths();
    vector<double> leaves2 = t2.getLeafEdgeLengths(); // Assuming these are the same leaves

    // Collect length differences for internal edges...
    for (PhyloTreeEdge &pte : eic) {
        wrf_value += abs(pte.getLength());
    }

    for (PhyloTreeEdge &pte : enic) {
        wrf_value += abs(pte.getLength());
    }

    // ... and leaves
    for (int i = 0; i < leaves1.size(); i++) {
        wrf_value += abs(leaves1[i] - leaves2[i]);
    }

    if (normalise) return wrf_value / (t1.getBranchLengthSum() + t2.getBranchLengthSum());
    return wrf_value;
}